

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O2

bool __thiscall
InliningDecider::CanRecursivelyInline
          (InliningDecider *this,FunctionBody *inlinee,FunctionBody *inliner,
          bool allowRecursiveInlining,uint recursiveInlineDepth)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  undefined4 extraout_var_00;
  char16 *pcVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar8;
  uint uVar9;
  wchar local_e8 [4];
  char16 debugStringBuffer [42];
  wchar local_88 [4];
  char16 debugStringBuffer2 [42];
  
  debugStringBuffer2._76_4_ = recursiveInlineDepth;
  uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineRecursivePhase,uVar2,LVar3);
  if ((((inlinee != inliner) || (bVar1)) || (!allowRecursiveInlining)) ||
     (bVar1 = Js::FunctionBody::CanInlineRecursively(inlinee,debugStringBuffer2._76_4_,true), !bVar1
     )) {
    uVar9 = 0xff;
    if ((int)DAT_0143ef18 < 0xff) {
      uVar9 = DAT_0143ef18;
    }
    uVar8 = 1;
    if (1 < (int)uVar9) {
      uVar8 = uVar9;
    }
    if (inlinee->inlineDepth < uVar8) {
      return true;
    }
    uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar2,LVar3);
    if (!bVar1) {
      return false;
    }
    iVar4 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    pcVar6 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inlinee,(wchar (*) [42])local_e8)
    ;
    iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar7 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inliner,(wchar (*) [42])local_88)
    ;
    bVar1 = false;
    Output::Print(L"INLINING: Skip Inline: Do not inline recursive functions\tInlinee: %s (%s)\tCaller: %s (%s)\n"
                  ,CONCAT44(extraout_var_01,iVar4),pcVar6,CONCAT44(extraout_var_02,iVar5),pcVar7);
  }
  else {
    uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar2,LVar3);
    if (!bVar1) {
      return true;
    }
    iVar4 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    pcVar6 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inlinee,(wchar (*) [42])local_e8)
    ;
    iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar7 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)inliner,(wchar (*) [42])local_88)
    ;
    Output::Print(L"INLINING: Inlined recursively\tInlinee: %s (%s)\tCaller: %s (%s)\tDepth: %d\n",
                  CONCAT44(extraout_var,iVar4),pcVar6,CONCAT44(extraout_var_00,iVar5),pcVar7,
                  (ulong)(uint)debugStringBuffer2._76_4_);
    bVar1 = true;
  }
  Output::Flush();
  return bVar1;
}

Assistant:

bool InliningDecider::CanRecursivelyInline(Js::FunctionBody * inlinee, Js::FunctionBody *inliner, bool allowRecursiveInlining, uint recursiveInlineDepth)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif


    if (!PHASE_OFF(Js::InlineRecursivePhase, inliner)
        && allowRecursiveInlining
        &&  inlinee == inliner
        &&  inlinee->CanInlineRecursively(recursiveInlineDepth))
    {
        INLINE_TESTTRACE(_u("INLINING: Inlined recursively\tInlinee: %s (%s)\tCaller: %s (%s)\tDepth: %d\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2), recursiveInlineDepth);
        return true;
    }

    if (!inlinee->CanInlineAgain())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Do not inline recursive functions\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    return true;
}